

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)1>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>_>_>
 __thiscall
wabt::MakeUnique<wabt::LoadStoreExpr<(wabt::ExprType)1>,wabt::Opcode&,int,unsigned_long&>
          (wabt *this,Opcode *args,int *args_1,unsigned_long *args_2)

{
  Enum EVar1;
  int iVar2;
  unsigned_long uVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x50);
  EVar1 = args->enum_;
  iVar2 = *args_1;
  uVar3 = *args_2;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  *(undefined8 *)((long)puVar4 + 0x24) = 0;
  *(undefined8 *)((long)puVar4 + 0x2c) = 0;
  *(undefined4 *)(puVar4 + 7) = 1;
  *puVar4 = &PTR__Expr_00199e88;
  *(Enum *)((long)puVar4 + 0x3c) = EVar1;
  puVar4[8] = (long)iVar2;
  puVar4[9] = uVar3;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<wabt::LoadStoreExpr<(wabt::ExprType)1>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>_>,_true,_true>
          )(__uniq_ptr_data<wabt::LoadStoreExpr<(wabt::ExprType)1>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}